

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_unsigned_integer.h
# Opt level: O1

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,short,2u,2u>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               unsigned_integer_t<short,_2U,_2U> *fmt)

{
  short sVar1;
  ulong uVar2;
  
  sVar1 = 0;
  for (uVar2 = 0; uVar2 < 2; uVar2 = uVar2 + 1) {
    if ((end->m_position == pos->m_position) || (9 < (byte)(pos->m_cache[pos->m_position] - 0x30U)))
    goto LAB_001088d9;
    sVar1 = ((byte)pos->m_cache[pos->m_position] & 0xf) + sVar1 * 10;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  }
  uVar2 = 2;
LAB_001088d9:
  if (1 < uVar2) {
    *fmt->value = sVar1;
  }
  return 1 < uVar2;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, unsigned_integer_t<UnsignedInt, MinLength, MaxLength>& fmt, Others&&... others)
{
    using char_type  = typename iterator_traits<Iterator>::value_type;

    auto x = UnsignedInt{ 0 };
    auto count = std::size_t{ 0 };
    while (count < MaxLength)
    {
        if (pos == end)
            break;

        const char_type ch = *pos;
        if ((ch < char_type{ '0' }) || (ch > char_type{ '9' }))
            break;

        x = 10 * x + static_cast<UnsignedInt>(ch - char_type{ '0' });
        ++count;
        ++pos;
    }

    if (count < MinLength)
        return false;

    fmt.value = x;
    return read_impl(pos, end, std::forward<Others>(others)...);
}